

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

AST * jsonnet::internal::jsonnet_parse(Allocator *alloc,Tokens *tokens)

{
  _List_node_base *p_Var1;
  AST *pAVar2;
  ostream *o;
  StaticError *this;
  string local_1d0;
  Parser parser;
  stringstream ss;
  ostream local_190 [376];
  
  parser.tokens = tokens;
  parser.alloc = alloc;
  pAVar2 = anon_unknown_0::Parser::parse(&parser,0xf);
  if (*(int *)&(tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 0x24) {
    return pAVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  o = std::operator<<(local_190,"did not expect: ");
  operator<<(o,(Token *)((tokens->
                         super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                         )._M_impl._M_node.super__List_node_base._M_next + 1));
  this = (StaticError *)__cxa_allocate_exception(0x60);
  p_Var1 = (tokens->
           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::stringbuf::str();
  StaticError::StaticError(this,(LocationRange *)(p_Var1 + 9),&local_1d0);
  __cxa_throw(this,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

AST *jsonnet_parse(Allocator *alloc, Tokens &tokens)
{
    Parser parser(tokens, alloc);
    AST *expr = parser.parse(MAX_PRECEDENCE);
    if (tokens.front().kind != Token::END_OF_FILE) {
        std::stringstream ss;
        ss << "did not expect: " << tokens.front();
        throw StaticError(tokens.front().location, ss.str());
    }

    return expr;
}